

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

ResolvedParameter __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::asVariable(BrandedDecl *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  ResolvedParameter *pRVar4;
  ResolvedParameter RVar5;
  Fault local_28;
  Fault f;
  BrandedDecl *this_local;
  
  f.exception = (Exception *)this;
  bVar3 = kj::
          OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
          ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>(&this->body);
  if (!bVar3) {
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x3a4,FAILED,"body.is<Resolver::ResolvedParameter>()","");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  pRVar4 = kj::
           OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
           ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>(&this->body);
  uVar1 = pRVar4->id;
  uVar2 = pRVar4->index;
  RVar5.index = uVar2;
  RVar5.id = uVar1;
  RVar5._12_4_ = 0;
  return RVar5;
}

Assistant:

NodeTranslator::Resolver::ResolvedParameter NodeTranslator::BrandedDecl::asVariable() {
  KJ_REQUIRE(body.is<Resolver::ResolvedParameter>());

  return body.get<Resolver::ResolvedParameter>();
}